

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O0

bool __thiscall
QuantLib::EndCriteria::checkStationaryFunctionValue
          (EndCriteria *this,RealType fxOld,RealType fxNew,size_t *statStateIterations,Type *ecType)

{
  Type *ecType_local;
  size_t *statStateIterations_local;
  RealType fxNew_local;
  RealType fxOld_local;
  EndCriteria *this_local;
  bool local_1;
  
  if (ABS(fxNew - fxOld) < this->functionEpsilon_) {
    *statStateIterations = *statStateIterations + 1;
    if (this->maxStationaryStateIterations_ < *statStateIterations) {
      *ecType = StationaryFunctionValue;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    *statStateIterations = 0;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool EndCriteria::checkStationaryFunctionValue(
      const RealType fxOld, const RealType fxNew, size_t& statStateIterations,
      EndCriteria::Type& ecType) const {
    if (std::fabs(fxNew - fxOld) >= functionEpsilon_) {
      statStateIterations = 0;
      return false;
    }
    ++statStateIterations;
    if (statStateIterations <= maxStationaryStateIterations_) return false;
    ecType = StationaryFunctionValue;
    return true;
  }